

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_rb_acquire_read(ma_rb *pRB,size_t *pSizeInBytes,void **ppBufferOut)

{
  ma_result mVar1;
  uint uVar2;
  ulong uVar3;
  
  mVar1 = MA_INVALID_ARGS;
  if (ppBufferOut != (void **)0x0 && (pSizeInBytes != (size_t *)0x0 && pRB != (ma_rb *)0x0)) {
    if ((int)(pRB->encodedReadOffset ^ pRB->encodedWriteOffset) < 0) {
      uVar2 = pRB->subbufferSizeInBytes;
    }
    else {
      uVar2 = pRB->encodedWriteOffset & 0x7fffffff;
    }
    uVar3 = (ulong)(uVar2 - (pRB->encodedReadOffset & 0x7fffffff));
    if (*pSizeInBytes < uVar3) {
      uVar3 = *pSizeInBytes;
    }
    *pSizeInBytes = uVar3;
    *ppBufferOut = (void *)((ulong)(pRB->encodedReadOffset & 0x7fffffff) + (long)pRB->pBuffer);
    mVar1 = MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_rb_acquire_read(ma_rb* pRB, size_t* pSizeInBytes, void** ppBufferOut)
{
    ma_uint32 writeOffset;
    ma_uint32 writeOffsetInBytes;
    ma_uint32 writeOffsetLoopFlag;
    ma_uint32 readOffset;
    ma_uint32 readOffsetInBytes;
    ma_uint32 readOffsetLoopFlag;
    size_t bytesAvailable;
    size_t bytesRequested;

    if (pRB == NULL || pSizeInBytes == NULL || ppBufferOut == NULL) {
        return MA_INVALID_ARGS;
    }

    /* The returned buffer should never move ahead of the write pointer. */
    writeOffset = ma_atomic_load_32(&pRB->encodedWriteOffset);
    ma_rb__deconstruct_offset(writeOffset, &writeOffsetInBytes, &writeOffsetLoopFlag);

    readOffset = ma_atomic_load_32(&pRB->encodedReadOffset);
    ma_rb__deconstruct_offset(readOffset, &readOffsetInBytes, &readOffsetLoopFlag);

    /*
    The number of bytes available depends on whether or not the read and write pointers are on the same loop iteration. If so, we
    can only read up to the write pointer. If not, we can only read up to the end of the buffer.
    */
    if (readOffsetLoopFlag == writeOffsetLoopFlag) {
        bytesAvailable = writeOffsetInBytes - readOffsetInBytes;
    } else {
        bytesAvailable = pRB->subbufferSizeInBytes - readOffsetInBytes;
    }

    bytesRequested = *pSizeInBytes;
    if (bytesRequested > bytesAvailable) {
        bytesRequested = bytesAvailable;
    }

    *pSizeInBytes = bytesRequested;
    (*ppBufferOut) = ma_rb__get_read_ptr(pRB);

    return MA_SUCCESS;
}